

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_alpha_as_black_optimization(dxt1_endpoint_optimizer *this)

{
  uint uVar1;
  results *prVar2;
  unique_color *puVar3;
  params *ppVar4;
  uint i_1;
  uint uVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  long lVar8;
  uint i_2;
  ulong uVar9;
  vector<crnlib::color_quad<unsigned_char,_int>_> trial_colors;
  vector<unsigned_char> trial_selectors;
  params trial_params;
  color_quad_u8 c [4];
  vector<crnlib::color_quad<unsigned_char,_int>_> local_a8;
  vector<unsigned_char> local_98;
  results local_88;
  params local_68;
  color_quad_u8 local_38 [4];
  
  prVar2 = this->m_pResults;
  puVar3 = (this->m_unique_colors).m_p;
  uVar1 = (this->m_unique_colors).m_size;
  uVar6 = 0;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    if ((puVar3[uVar7].m_color.field_0.field_0.r < 5) &&
       (puVar3[uVar7].m_color.field_0.field_0.g < 5)) {
      uVar6 = uVar6 + (puVar3[uVar7].m_color.field_0.field_0.b < 5);
    }
  }
  if (uVar6 != uVar1 && uVar6 != 0) {
    ppVar4 = this->m_pParams;
    local_68.m_endpoint_caching = ppVar4->m_endpoint_caching;
    local_68.m_use_transparent_indices_for_black = ppVar4->m_use_transparent_indices_for_black;
    local_68.m_force_alpha_blocks = ppVar4->m_force_alpha_blocks;
    local_68._35_5_ = *(undefined5 *)&ppVar4->field_0x23;
    local_68.m_block_index = ppVar4->m_block_index;
    local_68._4_4_ = *(undefined4 *)&ppVar4->field_0x4;
    local_68.m_pPixels = ppVar4->m_pPixels;
    local_68.m_num_pixels = ppVar4->m_num_pixels;
    local_68.m_dxt1a_alpha_threshold = ppVar4->m_dxt1a_alpha_threshold;
    local_68.m_quality = ppVar4->m_quality;
    local_68.m_pixels_have_alpha = ppVar4->m_pixels_have_alpha;
    local_68.m_use_alpha_blocks = ppVar4->m_use_alpha_blocks;
    local_68.m_perceptual = ppVar4->m_perceptual;
    local_68.m_grayscale_sampling = ppVar4->m_grayscale_sampling;
    local_a8.m_p = (color_quad<unsigned_char,_int> *)0x0;
    local_a8.m_size = 0;
    local_a8.m_capacity = 0;
    vector<crnlib::color_quad<unsigned_char,_int>_>::insert
              (&local_a8,0,ppVar4->m_pPixels,ppVar4->m_num_pixels);
    local_68.m_pPixels = local_a8.m_p;
    local_68.m_pixels_have_alpha = true;
    for (uVar7 = 0; uVar7 < (local_a8._8_8_ & 0xffffffff); uVar7 = uVar7 + 1) {
      if (((local_a8.m_p[uVar7].field_0.field_0.r < 5) &&
          (local_a8.m_p[uVar7].field_0.field_0.g < 5)) &&
         (local_a8.m_p[uVar7].field_0.field_0.b < 5)) {
        local_a8.m_p[uVar7].field_0.field_0.a = '\0';
      }
    }
    vector<unsigned_char>::vector(&local_98,this->m_pParams->m_num_pixels);
    local_88.m_pSelectors = local_98.m_p;
    compute_internal(this,&local_68,&local_88);
    dxt1_block::get_block_colors3(local_38,local_88.m_low_color,local_88.m_high_color);
    lVar8 = 0;
    uVar9 = 0;
    for (uVar7 = 0; uVar7 < (local_a8._8_8_ & 0xffffffff); uVar7 = uVar7 + 1) {
      uVar5 = color_distance(this,this->m_perceptual,
                             (color_quad_u8 *)((long)&(local_a8.m_p)->field_0 + lVar8),
                             local_38 + local_98.m_p[uVar7],false);
      uVar9 = uVar9 + uVar5;
      lVar8 = lVar8 + 4;
    }
    if (uVar9 < prVar2->m_error) {
      prVar2->m_error = uVar9;
      prVar2->m_low_color = local_88.m_low_color;
      prVar2->m_high_color = local_88.m_high_color;
      if (prVar2->m_pSelectors != (uint8 *)0x0) {
        memcpy(prVar2->m_pSelectors,local_88.m_pSelectors,(ulong)this->m_pParams->m_num_pixels);
      }
      prVar2->m_alpha_block = true;
    }
    vector<unsigned_char>::~vector(&local_98);
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&local_a8);
  }
  return true;
}

Assistant:

bool dxt1_endpoint_optimizer::try_alpha_as_black_optimization()
    {
        results* pOrig_results = m_pResults;

        uint num_dark_colors = 0;

        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            if ((m_unique_colors[i].m_color[0] <= 4) && (m_unique_colors[i].m_color[1] <= 4) && (m_unique_colors[i].m_color[2] <= 4))
            {
                num_dark_colors++;
            }
        }

        if ((!num_dark_colors) || (num_dark_colors == m_unique_colors.size()))
        {
            return true;
        }

        params trial_params(*m_pParams);
        crnlib::vector<color_quad_u8> trial_colors;
        trial_colors.insert(0, m_pParams->m_pPixels, m_pParams->m_num_pixels);

        trial_params.m_pPixels = trial_colors.get_ptr();
        trial_params.m_pixels_have_alpha = true;

        for (uint i = 0; i < trial_colors.size(); i++)
        {
            if ((trial_colors[i][0] <= 4) && (trial_colors[i][1] <= 4) && (trial_colors[i][2] <= 4))
            {
                trial_colors[i][3] = 0;
            }
        }

        results trial_results;

        crnlib::vector<uint8> trial_selectors(m_pParams->m_num_pixels);
        trial_results.m_pSelectors = trial_selectors.get_ptr();

        compute_internal(trial_params, trial_results);

        CRNLIB_ASSERT(trial_results.m_alpha_block);

        color_quad_u8 c[4];
        dxt1_block::get_block_colors3(c, trial_results.m_low_color, trial_results.m_high_color);

        uint64 trial_error = 0;

        for (uint i = 0; i < trial_colors.size(); i++)
        {
            if (trial_colors[i][3] == 0)
            {
                CRNLIB_ASSERT(trial_selectors[i] == 3);
            }
            else
            {
                CRNLIB_ASSERT(trial_selectors[i] != 3);
            }

            trial_error += color_distance(m_perceptual, trial_colors[i], c[trial_selectors[i]], false);
        }

        if (trial_error < pOrig_results->m_error)
        {
            pOrig_results->m_error = trial_error;

            pOrig_results->m_low_color = trial_results.m_low_color;
            pOrig_results->m_high_color = trial_results.m_high_color;

            if (pOrig_results->m_pSelectors)
            {
                memcpy(pOrig_results->m_pSelectors, trial_results.m_pSelectors, m_pParams->m_num_pixels);
            }

            pOrig_results->m_alpha_block = true;
        }

        return true;
    }